

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter * __thiscall
cfd::core::ConfidentialTxOut::Unblind
          (UnblindParameter *__return_storage_ptr__,ConfidentialTxOut *this,Privkey *blinding_key)

{
  bool bVar1;
  undefined8 uVar2;
  UnblindParameter *pUVar3;
  CfdError error_code;
  allocator local_41;
  string local_40 [32];
  Privkey *local_20;
  Privkey *blinding_key_local;
  ConfidentialTxOut *this_local;
  
  pUVar3 = __return_storage_ptr__;
  local_20 = blinding_key;
  blinding_key_local = (Privkey *)this;
  this_local = (ConfidentialTxOut *)__return_storage_ptr__;
  bVar1 = ConfidentialValue::HasBlinding(&this->confidential_value_);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)pUVar3 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"This output is not blinded.",&local_41);
    CfdException::CfdException((CfdException *)this,error_code,(string *)__return_storage_ptr__);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialTransaction::CalculateUnblindData
            (__return_storage_ptr__,&this->nonce_,local_20,&this->range_proof_,
             &this->confidential_value_,&(this->super_AbstractTxOut).locking_script_,&this->asset_);
  return pUVar3;
}

Assistant:

UnblindParameter ConfidentialTxOut::Unblind(
    const Privkey &blinding_key) const {
  if (!confidential_value_.HasBlinding()) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "This output is not blinded.");
  }
  return ConfidentialTransaction::CalculateUnblindData(
      nonce_, blinding_key, range_proof_, confidential_value_, locking_script_,
      asset_);
}